

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inverters.cpp
# Opt level: O0

bool Kernel::Rebalancing::Inverters::nonZero<Kernel::NumTraits<Kernel::RealConstantType>>
               (TermList *t)

{
  TermList t_00;
  TermList t_01;
  bool bVar1;
  bool bVar2;
  RealConstantType *this;
  undefined8 *in_RDI;
  Option<const_Kernel::RealConstantType_&> n2;
  Option<const_Kernel::RealConstantType_&> n1;
  NumTraits<Kernel::RealConstantType> n;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  RealConstantType *in_stack_ffffffffffffff40;
  undefined6 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  bool local_99;
  int *in_stack_ffffffffffffff78;
  RealConstantType *in_stack_ffffffffffffff80;
  OptionBaseRef<const_Kernel::RealConstantType_*> local_30;
  undefined8 local_28;
  OptionBaseRef<const_Kernel::RealConstantType_*> local_20;
  undefined1 local_11;
  byte local_1;
  
  local_11 = 0;
  local_28 = *in_RDI;
  t_00._content._6_1_ = in_stack_ffffffffffffff4e;
  t_00._content._0_6_ = in_stack_ffffffffffffff48;
  t_00._content._7_1_ = in_stack_ffffffffffffff4f;
  NumTraits<Kernel::RealConstantType>::tryNumeral(t_00);
  asig<Kernel::NumTraits<Kernel::RealConstantType>>();
  t_01._content._6_1_ = in_stack_ffffffffffffff4e;
  t_01._content._0_6_ = in_stack_ffffffffffffff48;
  t_01._content._7_1_ = in_stack_ffffffffffffff4f;
  AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>::tryNumeral<Kernel::TermList>(t_01);
  bVar2 = Lib::OptionBaseRef<const_Kernel::RealConstantType_*>::isSome(&local_20);
  bVar1 = false;
  local_99 = false;
  if (bVar2) {
    Lib::Option<const_Kernel::RealConstantType_&>::operator*
              ((Option<const_Kernel::RealConstantType_&> *)0x95505b);
    RealConstantType::RealConstantType
              (in_stack_ffffffffffffff40,
               (RealConstantType *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    bVar1 = true;
    bVar2 = Kernel::operator!=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_1 = true;
    if (bVar2) goto LAB_00955115;
  }
  local_99 = Lib::OptionBaseRef<const_Kernel::RealConstantType_*>::isSome(&local_30);
  local_1 = false;
  if (local_99) {
    this = Lib::Option<const_Kernel::RealConstantType_&>::operator*
                     ((Option<const_Kernel::RealConstantType_&> *)0x9550c9);
    RealConstantType::RealConstantType
              (this,(RealConstantType *)
                    CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    local_1 = Kernel::operator!=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
LAB_00955115:
  if (local_99 != false) {
    RealConstantType::~RealConstantType((RealConstantType *)0x955135);
  }
  if (bVar1) {
    RealConstantType::~RealConstantType((RealConstantType *)0x955148);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool nonZero(const TermList &t) {
  NumTraits n{};
  auto n1 = n.tryNumeral(t);
  auto n2 = asig(n).tryNumeral(t);
  return ( n1.isSome() && *n1 != 0 ) 
      || ( n2.isSome() && *n2 != 0 );
}